

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_allEqual_vec3(ShaderEvalContext *c)

{
  bool bVar1;
  int i;
  long lVar2;
  undefined8 local_18;
  float local_10;
  float local_c;
  undefined8 local_8;
  
  local_c = c->in[0].m_data[2];
  local_8 = *(undefined8 *)c->in[0].m_data;
  local_18 = *(undefined8 *)(c->in[1].m_data + 1);
  local_10 = c->in[1].m_data[0];
  bVar1 = true;
  lVar2 = 0;
  do {
    if (bVar1) {
      bVar1 = *(float *)((long)&local_18 + lVar2 * 4) == (&local_c)[lVar2];
    }
    else {
      bVar1 = false;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (c->color).m_data[0] = (float)bVar1;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }